

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateOtherTopLevelUpdateParameters
                   (Result *__return_storage_ptr__,NetworkUpdateParameters *updateParameters)

{
  bool bVar1;
  Int64Parameter *pIVar2;
  allocator local_a9;
  string local_a8;
  string err;
  undefined1 local_68 [40];
  Result r;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if ((updateParameters ==
       (NetworkUpdateParameters *)&CoreML::Specification::_NetworkUpdateParameters_default_instance_
      ) || (updateParameters->epochs_ == (Int64Parameter *)0x0)) {
    std::__cxx11::string::assign((char *)&err);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"epochs",&local_a9);
    pIVar2 = updateParameters->epochs_;
    if (pIVar2 == (Int64Parameter *)0x0) {
      pIVar2 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
    }
    CoreML::validateInt64Parameter((Result *)local_68,&local_a8,pIVar2,true);
    CoreML::Result::operator=(&r,(Result *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = CoreML::Result::good(&r);
    if ((bVar1) && (updateParameters->seed_ != (Int64Parameter *)0x0)) {
      std::__cxx11::string::string((string *)&local_a8,"seed",&local_a9);
      pIVar2 = updateParameters->seed_;
      if (pIVar2 == (Int64Parameter *)0x0) {
        pIVar2 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_68,&local_a8,pIVar2,false);
      CoreML::Result::operator=(&r,(Result *)local_68);
      std::__cxx11::string::~string((string *)(local_68 + 8));
      std::__cxx11::string::~string((string *)&local_a8);
      CoreML::Result::good(&r);
    }
    CoreML::Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

static Result validateOtherTopLevelUpdateParameters(const Specification::NetworkUpdateParameters& updateParameters) {
    Result r;
    std::string err;
    
    if (false == updateParameters.has_epochs()) {
        err = "Epochs should be included in neural network update parameters.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    r = validateInt64Parameter("epochs", updateParameters.epochs(), true);
    if (!r.good()) {return r;}

    if (updateParameters.has_seed()) {
        r = validateInt64Parameter("seed", updateParameters.seed(), false);
        if (!r.good()) {return r;}
    }

    return r;
}